

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BatchKmersCounter.cc
# Opt level: O3

void __thiscall KmerList::uniq(KmerList *this)

{
  long lVar1;
  undefined8 uVar2;
  KMerNodeFreq_s *pKVar3;
  KMerNodeFreq_s *pKVar4;
  KMerNodeFreq_s *pKVar5;
  uint8_t uVar6;
  uint uVar7;
  
  pKVar3 = this->kmers;
  pKVar4 = pKVar3;
  if (0 < (long)this->size) {
    pKVar5 = pKVar3 + this->size;
    do {
      pKVar4->count = pKVar3->count;
      uVar2 = *(undefined8 *)((long)&pKVar3->kdata + 8);
      *(long *)&pKVar4->kdata = (long)pKVar3->kdata;
      *(undefined8 *)((long)&pKVar4->kdata + 8) = uVar2;
      pKVar3 = pKVar3 + 1;
      if (pKVar3 < pKVar5) {
        lVar1 = *(long *)((long)&pKVar4->kdata + 8);
        do {
          if (*(long *)((long)&pKVar3->kdata + 8) != lVar1 ||
              (long)pKVar3->kdata != (long)pKVar4->kdata) break;
          uVar7 = (uint)pKVar3->count + (uint)pKVar4->count;
          uVar6 = (uint8_t)uVar7;
          if (0xfe < uVar7) {
            uVar6 = 0xff;
          }
          pKVar4->count = uVar6;
          pKVar3 = pKVar3 + 1;
        } while (pKVar3 < pKVar5);
      }
      pKVar4 = pKVar4 + 1;
    } while (pKVar3 < pKVar5);
    pKVar3 = this->kmers;
  }
  resize(this,((long)pKVar4 - (long)pKVar3) * -0xf0f0f0f0f0f0f0f);
  return;
}

Assistant:

void KmerList::uniq() {
    auto wptr = kmers;
    auto endptr = kmers + size;
    for (auto rptr = kmers; rptr < endptr; ++wptr) {
        *wptr = *rptr;
        ++rptr;
        while (rptr < endptr and *wptr == *rptr) {
            wptr->combine(*rptr);
            ++rptr;
        }
    }
    resize(wptr - kmers);
}